

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psquare_suite.cpp
# Opt level: O0

void double_quartile_suite::test_linear_increase(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  close_to<double> predicate_09;
  close_to<double> predicate_10;
  close_to<double> predicate_11;
  close_to<double> predicate_12;
  close_to<double> predicate_13;
  close_to<double> predicate_14;
  close_to<double> predicate_15;
  close_to<double> predicate_16;
  close_to<double> predicate_17;
  close_to<double> predicate_18;
  close_to<double> predicate_19;
  close_to<double> predicate_20;
  close_to<double> predicate_21;
  close_to<double> predicate_22;
  close_to<double> predicate_23;
  close_to<double> predicate_24;
  close_to<double> predicate_25;
  close_to<double> predicate_26;
  close_to<double> predicate_27;
  close_to<double> predicate_28;
  close_to<double> predicate_29;
  close_to<double> predicate_30;
  close_to<double> predicate_31;
  close_to<double> predicate_32;
  close_to<double> predicate_33;
  close_to<double> predicate_34;
  close_to<double> predicate_35;
  close_to<double> predicate_36;
  close_to<double> predicate_37;
  close_to<double> predicate_38;
  close_to<double> predicate_39;
  close_to<double> predicate_40;
  close_to<double> predicate_41;
  close_to<double> predicate_42;
  close_to<double> predicate_43;
  close_to<double> predicate_44;
  close_to<double> predicate_45;
  close_to<double> predicate_46;
  close_to<double> predicate_47;
  close_to<double> predicate_48;
  close_to<double> predicate_49;
  close_to<double> predicate_50;
  close_to<double> predicate_51;
  close_to<double> predicate_52;
  close_to<double> predicate_53;
  close_to<double> predicate_54;
  close_to<double> predicate_55;
  close_to<double> predicate_56;
  close_to<double> predicate_57;
  close_to<double> predicate_58;
  close_to<double> predicate_59;
  close_to<double> predicate_60;
  close_to<double> predicate_61;
  close_to<double> predicate_62;
  close_to<double> predicate_63;
  close_to<double> predicate_64;
  close_to<double> predicate_65;
  close_to<double> predicate_66;
  close_to<double> predicate_67;
  close_to<double> predicate_68;
  close_to<double> predicate_69;
  close_to<double> predicate_70;
  close_to<double> predicate_71;
  close_to<double> predicate_72;
  close_to<double> predicate_73;
  close_to<double> predicate_74;
  close_to<double> predicate_75;
  close_to<double> predicate_76;
  close_to<double> predicate_77;
  close_to<double> predicate_78;
  close_to<double> predicate_79;
  close_to<double> predicate_80;
  close_to<double> predicate_81;
  close_to<double> predicate_82;
  close_to<double> predicate_83;
  close_to<double> predicate_84;
  close_to<double> predicate_85;
  close_to<double> predicate_86;
  close_to<double> predicate_87;
  close_to<double> predicate_88;
  close_to<double> predicate_89;
  close_to<double> predicate_90;
  close_to<double> predicate_91;
  close_to<double> predicate_92;
  close_to<double> predicate_93;
  close_to<double> predicate_94;
  close_to<double> predicate_95;
  close_to<double> predicate_96;
  close_to<double> predicate_97;
  close_to<double> predicate_98;
  close_to<double> predicate_99;
  close_to<double> predicate_x00100;
  close_to<double> predicate_x00101;
  close_to<double> predicate_x00102;
  close_to<double> predicate_x00103;
  double absolute_tolerance;
  double *in_stack_fffffffffffff198;
  double local_e50;
  value_type_conflict local_e48;
  double local_e40;
  double local_e30;
  value_type_conflict local_e28;
  double local_e20;
  double local_e10;
  value_type_conflict local_e08;
  double local_e00;
  double local_df0;
  value_type_conflict local_de8;
  double local_de0;
  double local_dd0;
  value_type_conflict local_dc8;
  double local_dc0;
  double local_db0;
  value_type_conflict local_da8;
  double local_da0;
  double local_d90;
  value_type_conflict local_d88;
  double local_d80;
  double local_d70;
  value_type_conflict local_d68;
  double local_d60;
  double local_d50;
  value_type_conflict local_d48;
  double local_d40;
  double local_d30;
  value_type_conflict local_d28;
  double local_d20;
  double local_d10;
  value_type_conflict local_d08;
  double local_d00;
  double local_cf0;
  value_type_conflict local_ce8;
  double local_ce0;
  double local_cd0;
  value_type_conflict local_cc8;
  double local_cc0;
  double local_cb0;
  value_type_conflict local_ca8;
  double local_ca0;
  double local_c90;
  value_type_conflict local_c88;
  double local_c80;
  double local_c70;
  value_type_conflict local_c68;
  double local_c60;
  double local_c50;
  value_type_conflict local_c48;
  double local_c40;
  double local_c30;
  value_type_conflict local_c28;
  double local_c20;
  double local_c10;
  value_type_conflict local_c08;
  double local_c00;
  double local_bf0;
  value_type_conflict local_be8;
  double local_be0;
  double local_bd0;
  value_type_conflict local_bc8;
  double local_bc0;
  double local_bb0;
  value_type_conflict local_ba8;
  double local_ba0;
  double local_b90;
  value_type_conflict local_b88;
  double local_b80;
  double local_b70;
  value_type_conflict local_b68;
  double local_b60;
  double local_b50;
  value_type_conflict local_b48;
  double local_b40;
  double local_b30;
  value_type_conflict local_b28;
  double local_b20;
  double local_b10;
  value_type_conflict local_b08;
  double local_b00;
  double local_af0;
  value_type_conflict local_ae8;
  double local_ae0;
  double local_ad0;
  value_type_conflict local_ac8;
  double local_ac0;
  double local_ab0;
  value_type_conflict local_aa8;
  double local_aa0;
  double local_a90;
  value_type_conflict local_a88;
  double local_a80;
  double local_a70;
  value_type_conflict local_a68;
  double local_a60;
  double local_a50;
  value_type_conflict local_a48;
  double local_a40;
  double local_a30;
  value_type_conflict local_a28;
  double local_a20;
  double local_a10;
  value_type_conflict local_a08;
  double local_a00;
  double local_9f0;
  value_type_conflict local_9e8;
  double local_9e0;
  double local_9d0;
  value_type_conflict local_9c8;
  double local_9c0;
  double local_9b0;
  value_type_conflict local_9a8;
  double local_9a0;
  double local_990;
  value_type_conflict local_988;
  double local_980;
  double local_970;
  value_type_conflict local_968;
  double local_960;
  double local_950;
  value_type_conflict local_948;
  double local_940;
  double local_930;
  value_type_conflict local_928;
  double local_920;
  double local_910;
  value_type_conflict local_908;
  double local_900;
  double local_8f0;
  value_type_conflict local_8e8;
  double local_8e0;
  double local_8d0;
  value_type_conflict local_8c8;
  double local_8c0;
  double local_8b0;
  value_type_conflict local_8a8;
  double local_8a0;
  double local_890;
  value_type_conflict local_888;
  double local_880;
  double local_870;
  value_type_conflict local_868;
  double local_860;
  double local_850;
  value_type_conflict local_848;
  double local_840;
  double local_830;
  value_type_conflict local_828;
  double local_820;
  double local_810;
  value_type_conflict local_808;
  double local_800;
  double local_7f0;
  value_type_conflict local_7e8;
  double local_7e0;
  double local_7d0;
  value_type_conflict local_7c8;
  double local_7c0;
  double local_7b0;
  value_type_conflict local_7a8;
  double local_7a0;
  double local_790;
  value_type_conflict local_788;
  double local_780;
  double local_770;
  value_type_conflict local_768;
  double local_760;
  double local_750;
  value_type_conflict local_748;
  double local_740;
  double local_730;
  value_type_conflict local_728;
  double local_720;
  double local_710;
  value_type_conflict local_708;
  double local_700;
  double local_6f0;
  value_type_conflict local_6e8;
  double local_6e0;
  double local_6d0;
  value_type_conflict local_6c8;
  double local_6c0;
  double local_6b0;
  value_type_conflict local_6a8;
  double local_6a0;
  double local_690;
  value_type_conflict local_688;
  double local_680;
  double local_670;
  value_type_conflict local_668;
  double local_660;
  double local_650;
  value_type_conflict local_648;
  double local_640;
  double local_630;
  value_type_conflict local_628;
  double local_620;
  double local_610;
  value_type_conflict local_608;
  double local_600;
  double local_5f0;
  value_type_conflict local_5e8;
  double local_5e0;
  double local_5d0;
  value_type_conflict local_5c8;
  double local_5c0;
  double local_5b0;
  value_type_conflict local_5a8;
  double local_5a0;
  double local_590;
  value_type_conflict local_588;
  double local_580;
  double local_570;
  value_type_conflict local_568;
  double local_560;
  double local_550;
  value_type_conflict local_548;
  double local_540;
  double local_530;
  value_type_conflict local_528;
  double local_520;
  double local_510;
  value_type_conflict local_508;
  double local_500;
  double local_4f0;
  value_type_conflict local_4e8;
  double local_4e0;
  double local_4d0;
  value_type_conflict local_4c8;
  double local_4c0;
  double local_4b0;
  value_type_conflict local_4a8;
  double local_4a0;
  double local_490;
  value_type_conflict local_488;
  double local_480;
  double local_470;
  value_type_conflict local_468;
  double local_460;
  double local_450;
  value_type_conflict local_448;
  double local_440;
  double local_430;
  value_type_conflict local_428;
  double local_420;
  double local_410;
  value_type_conflict local_408;
  double local_400;
  double local_3f0;
  value_type_conflict local_3e8;
  double local_3e0;
  double local_3d0;
  value_type_conflict local_3c8;
  double local_3c0;
  double local_3b0;
  value_type_conflict local_3a8;
  double local_3a0;
  double local_390;
  value_type_conflict local_388;
  double local_380;
  double local_370;
  value_type_conflict local_368;
  double local_360;
  double local_350;
  value_type_conflict local_348;
  double local_340;
  double local_330;
  value_type_conflict local_328;
  double local_320;
  double local_310;
  value_type_conflict local_308;
  double local_300;
  double local_2f0;
  value_type_conflict local_2e8;
  double local_2e0;
  double local_2d0;
  value_type_conflict local_2c8;
  double local_2c0;
  double local_2b0;
  value_type_conflict local_2a8;
  double local_2a0;
  double local_290;
  value_type_conflict local_288;
  double local_280;
  double local_270;
  value_type_conflict local_268;
  double local_260;
  double local_250;
  value_type_conflict local_248;
  double local_240;
  double local_230;
  value_type_conflict local_228;
  double local_220;
  double local_210;
  value_type_conflict local_208;
  double local_200;
  double local_1f0;
  value_type_conflict local_1e8;
  double local_1e0;
  double local_1d0;
  value_type_conflict local_1c8;
  double local_1c0;
  double local_1b0;
  value_type_conflict local_1a8;
  double local_1a0;
  double local_190;
  value_type_conflict local_188;
  double local_180;
  double local_170;
  value_type_conflict local_168;
  double local_160;
  double local_150;
  value_type_conflict local_148;
  undefined1 local_140 [8];
  psquare_quartile<double> quantile;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)(quantile.constant_deltas._M_elems + 8),1e-05,absolute_tolerance);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::psquare
            ((psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_> *)
             local_140);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push
            ((psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_> *)
             local_140,1.0);
  local_148 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<0l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_150 = 1.0;
  local_160 = quantile.constant_deltas._M_elems[8];
  predicate_x00103.absolute = tolerance.relative;
  predicate_x00103.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x286,0x132900,(char *)&local_148,&local_150,in_stack_fffffffffffff198,
             predicate_x00103);
  local_168 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_170 = 1.0;
  local_180 = quantile.constant_deltas._M_elems[8];
  predicate_x00102.absolute = tolerance.relative;
  predicate_x00102.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x287,0x132900,(char *)&local_168,&local_170,in_stack_fffffffffffff198,
             predicate_x00102);
  local_188 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,2l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_190 = 1.0;
  local_1a0 = quantile.constant_deltas._M_elems[8];
  predicate_x00101.absolute = tolerance.relative;
  predicate_x00101.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x288,0x132900,(char *)&local_188,&local_190,in_stack_fffffffffffff198,
             predicate_x00101);
  local_1a8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<3l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_1b0 = 1.0;
  local_1c0 = quantile.constant_deltas._M_elems[8];
  predicate_x00100.absolute = tolerance.relative;
  predicate_x00100.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x289,0x132900,(char *)&local_1a8,&local_1b0,in_stack_fffffffffffff198,
             predicate_x00100);
  local_1c8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_1d0 = 1.0;
  local_1e0 = quantile.constant_deltas._M_elems[8];
  predicate_99.absolute = tolerance.relative;
  predicate_99.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x28a,0x132900,(char *)&local_1c8,&local_1d0,in_stack_fffffffffffff198,
             predicate_99);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push
            ((psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_> *)
             local_140,2.0);
  local_1e8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<0l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_1f0 = 1.0;
  local_200 = quantile.constant_deltas._M_elems[8];
  predicate_98.absolute = tolerance.relative;
  predicate_98.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x28d,0x132900,(char *)&local_1e8,&local_1f0,in_stack_fffffffffffff198,
             predicate_98);
  local_208 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_210 = 1.25;
  local_220 = quantile.constant_deltas._M_elems[8];
  predicate_97.absolute = tolerance.relative;
  predicate_97.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","1.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x28e,0x132900,(char *)&local_208,&local_210,in_stack_fffffffffffff198,
             predicate_97);
  local_228 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,2l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_230 = 1.5;
  local_240 = quantile.constant_deltas._M_elems[8];
  predicate_96.absolute = tolerance.relative;
  predicate_96.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","1.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x28f,0x132900,(char *)&local_228,&local_230,in_stack_fffffffffffff198,
             predicate_96);
  local_248 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<3l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_250 = 1.75;
  local_260 = quantile.constant_deltas._M_elems[8];
  predicate_95.absolute = tolerance.relative;
  predicate_95.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","1.75","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x290,0x132900,(char *)&local_248,&local_250,in_stack_fffffffffffff198,
             predicate_95);
  local_268 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_270 = 2.0;
  local_280 = quantile.constant_deltas._M_elems[8];
  predicate_94.absolute = tolerance.relative;
  predicate_94.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","2.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x291,0x132900,(char *)&local_268,&local_270,in_stack_fffffffffffff198,
             predicate_94);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push
            ((psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_> *)
             local_140,3.0);
  local_288 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<0l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_290 = 1.0;
  local_2a0 = quantile.constant_deltas._M_elems[8];
  predicate_93.absolute = tolerance.relative;
  predicate_93.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x294,0x132900,(char *)&local_288,&local_290,in_stack_fffffffffffff198,
             predicate_93);
  local_2a8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_2b0 = 1.5;
  local_2c0 = quantile.constant_deltas._M_elems[8];
  predicate_92.absolute = tolerance.relative;
  predicate_92.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","1.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x295,0x132900,(char *)&local_2a8,&local_2b0,in_stack_fffffffffffff198,
             predicate_92);
  local_2c8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,2l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_2d0 = 2.0;
  local_2e0 = quantile.constant_deltas._M_elems[8];
  predicate_91.absolute = tolerance.relative;
  predicate_91.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","2.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x296,0x132900,(char *)&local_2c8,&local_2d0,in_stack_fffffffffffff198,
             predicate_91);
  local_2e8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<3l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_2f0 = 2.5;
  local_300 = quantile.constant_deltas._M_elems[8];
  predicate_90.absolute = tolerance.relative;
  predicate_90.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","2.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x297,0x132900,(char *)&local_2e8,&local_2f0,in_stack_fffffffffffff198,
             predicate_90);
  local_308 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_310 = 3.0;
  local_320 = quantile.constant_deltas._M_elems[8];
  predicate_89.absolute = tolerance.relative;
  predicate_89.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","3.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x298,0x132900,(char *)&local_308,&local_310,in_stack_fffffffffffff198,
             predicate_89);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push
            ((psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_> *)
             local_140,4.0);
  local_328 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<0l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_330 = 1.0;
  local_340 = quantile.constant_deltas._M_elems[8];
  predicate_88.absolute = tolerance.relative;
  predicate_88.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x29b,0x132900,(char *)&local_328,&local_330,in_stack_fffffffffffff198,
             predicate_88);
  local_348 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_350 = 1.75;
  local_360 = quantile.constant_deltas._M_elems[8];
  predicate_87.absolute = tolerance.relative;
  predicate_87.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","1.75","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x29c,0x132900,(char *)&local_348,&local_350,in_stack_fffffffffffff198,
             predicate_87);
  local_368 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,2l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_370 = 2.5;
  local_380 = quantile.constant_deltas._M_elems[8];
  predicate_86.absolute = tolerance.relative;
  predicate_86.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","2.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x29d,0x132900,(char *)&local_368,&local_370,in_stack_fffffffffffff198,
             predicate_86);
  local_388 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<3l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_390 = 3.25;
  local_3a0 = quantile.constant_deltas._M_elems[8];
  predicate_85.absolute = tolerance.relative;
  predicate_85.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","3.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x29e,0x132900,(char *)&local_388,&local_390,in_stack_fffffffffffff198,
             predicate_85);
  local_3a8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_3b0 = 4.0;
  local_3c0 = quantile.constant_deltas._M_elems[8];
  predicate_84.absolute = tolerance.relative;
  predicate_84.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","4.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x29f,0x132900,(char *)&local_3a8,&local_3b0,in_stack_fffffffffffff198,
             predicate_84);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push
            ((psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_> *)
             local_140,5.0);
  local_3c8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<0l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_3d0 = 1.0;
  local_3e0 = quantile.constant_deltas._M_elems[8];
  predicate_83.absolute = tolerance.relative;
  predicate_83.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2a2,0x132900,(char *)&local_3c8,&local_3d0,in_stack_fffffffffffff198,
             predicate_83);
  local_3e8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_3f0 = 2.0;
  local_400 = quantile.constant_deltas._M_elems[8];
  predicate_82.absolute = tolerance.relative;
  predicate_82.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","2.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2a3,0x132900,(char *)&local_3e8,&local_3f0,in_stack_fffffffffffff198,
             predicate_82);
  local_408 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,2l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_410 = 3.0;
  local_420 = quantile.constant_deltas._M_elems[8];
  predicate_81.absolute = tolerance.relative;
  predicate_81.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","3.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2a4,0x132900,(char *)&local_408,&local_410,in_stack_fffffffffffff198,
             predicate_81);
  local_428 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<3l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_430 = 4.0;
  local_440 = quantile.constant_deltas._M_elems[8];
  predicate_80.absolute = tolerance.relative;
  predicate_80.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","4.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2a5,0x132900,(char *)&local_428,&local_430,in_stack_fffffffffffff198,
             predicate_80);
  local_448 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_450 = 5.0;
  local_460 = quantile.constant_deltas._M_elems[8];
  predicate_79.absolute = tolerance.relative;
  predicate_79.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","5.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2a6,0x132900,(char *)&local_448,&local_450,in_stack_fffffffffffff198,
             predicate_79);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push
            ((psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_> *)
             local_140,6.0);
  local_468 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<0l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_470 = 1.0;
  local_480 = quantile.constant_deltas._M_elems[8];
  predicate_78.absolute = tolerance.relative;
  predicate_78.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2a9,0x132900,(char *)&local_468,&local_470,in_stack_fffffffffffff198,
             predicate_78);
  local_488 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_490 = 2.25;
  local_4a0 = quantile.constant_deltas._M_elems[8];
  predicate_77.absolute = tolerance.relative;
  predicate_77.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","2.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2aa,0x132900,(char *)&local_488,&local_490,in_stack_fffffffffffff198,
             predicate_77);
  local_4a8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,2l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_4b0 = 3.5;
  local_4c0 = quantile.constant_deltas._M_elems[8];
  predicate_76.absolute = tolerance.relative;
  predicate_76.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","3.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2ab,0x132900,(char *)&local_4a8,&local_4b0,in_stack_fffffffffffff198,
             predicate_76);
  local_4c8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<3l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_4d0 = 4.75;
  local_4e0 = quantile.constant_deltas._M_elems[8];
  predicate_75.absolute = tolerance.relative;
  predicate_75.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","4.75","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2ac,0x132900,(char *)&local_4c8,&local_4d0,in_stack_fffffffffffff198,
             predicate_75);
  local_4e8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_4f0 = 6.0;
  local_500 = quantile.constant_deltas._M_elems[8];
  predicate_74.absolute = tolerance.relative;
  predicate_74.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","6.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2ad,0x132900,(char *)&local_4e8,&local_4f0,in_stack_fffffffffffff198,
             predicate_74);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push
            ((psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_> *)
             local_140,7.0);
  local_508 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<0l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_510 = 1.0;
  local_520 = quantile.constant_deltas._M_elems[8];
  predicate_73.absolute = tolerance.relative;
  predicate_73.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2b0,0x132900,(char *)&local_508,&local_510,in_stack_fffffffffffff198,
             predicate_73);
  local_528 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_530 = 2.5;
  local_540 = quantile.constant_deltas._M_elems[8];
  predicate_72.absolute = tolerance.relative;
  predicate_72.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","2.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2b1,0x132900,(char *)&local_528,&local_530,in_stack_fffffffffffff198,
             predicate_72);
  local_548 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,2l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_550 = 4.0;
  local_560 = quantile.constant_deltas._M_elems[8];
  predicate_71.absolute = tolerance.relative;
  predicate_71.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","4.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2b2,0x132900,(char *)&local_548,&local_550,in_stack_fffffffffffff198,
             predicate_71);
  local_568 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<3l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_570 = 5.5;
  local_580 = quantile.constant_deltas._M_elems[8];
  predicate_70.absolute = tolerance.relative;
  predicate_70.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","5.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2b3,0x132900,(char *)&local_568,&local_570,in_stack_fffffffffffff198,
             predicate_70);
  local_588 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_590 = 7.0;
  local_5a0 = quantile.constant_deltas._M_elems[8];
  predicate_69.absolute = tolerance.relative;
  predicate_69.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","7.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2b4,0x132900,(char *)&local_588,&local_590,in_stack_fffffffffffff198,
             predicate_69);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push
            ((psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_> *)
             local_140,8.0);
  local_5a8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<0l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_5b0 = 1.0;
  local_5c0 = quantile.constant_deltas._M_elems[8];
  predicate_68.absolute = tolerance.relative;
  predicate_68.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2b7,0x132900,(char *)&local_5a8,&local_5b0,in_stack_fffffffffffff198,
             predicate_68);
  local_5c8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_5d0 = 2.75;
  local_5e0 = quantile.constant_deltas._M_elems[8];
  predicate_67.absolute = tolerance.relative;
  predicate_67.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","2.75","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2b8,0x132900,(char *)&local_5c8,&local_5d0,in_stack_fffffffffffff198,
             predicate_67);
  local_5e8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,2l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_5f0 = 4.5;
  local_600 = quantile.constant_deltas._M_elems[8];
  predicate_66.absolute = tolerance.relative;
  predicate_66.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","4.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2b9,0x132900,(char *)&local_5e8,&local_5f0,in_stack_fffffffffffff198,
             predicate_66);
  local_608 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<3l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_610 = 6.25;
  local_620 = quantile.constant_deltas._M_elems[8];
  predicate_65.absolute = tolerance.relative;
  predicate_65.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","6.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2ba,0x132900,(char *)&local_608,&local_610,in_stack_fffffffffffff198,
             predicate_65);
  local_628 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_630 = 8.0;
  local_640 = quantile.constant_deltas._M_elems[8];
  predicate_64.absolute = tolerance.relative;
  predicate_64.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","8.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2bb,0x132900,(char *)&local_628,&local_630,in_stack_fffffffffffff198,
             predicate_64);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push
            ((psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_> *)
             local_140,9.0);
  local_648 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<0l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_650 = 1.0;
  local_660 = quantile.constant_deltas._M_elems[8];
  predicate_63.absolute = tolerance.relative;
  predicate_63.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2be,0x132900,(char *)&local_648,&local_650,in_stack_fffffffffffff198,
             predicate_63);
  local_668 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_670 = 3.0;
  local_680 = quantile.constant_deltas._M_elems[8];
  predicate_62.absolute = tolerance.relative;
  predicate_62.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","3.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2bf,0x132900,(char *)&local_668,&local_670,in_stack_fffffffffffff198,
             predicate_62);
  local_688 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,2l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_690 = 5.0;
  local_6a0 = quantile.constant_deltas._M_elems[8];
  predicate_61.absolute = tolerance.relative;
  predicate_61.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","5.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2c0,0x132900,(char *)&local_688,&local_690,in_stack_fffffffffffff198,
             predicate_61);
  local_6a8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<3l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_6b0 = 7.0;
  local_6c0 = quantile.constant_deltas._M_elems[8];
  predicate_60.absolute = tolerance.relative;
  predicate_60.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","7.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2c1,0x132900,(char *)&local_6a8,&local_6b0,in_stack_fffffffffffff198,
             predicate_60);
  local_6c8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_6d0 = 9.0;
  local_6e0 = quantile.constant_deltas._M_elems[8];
  predicate_59.absolute = tolerance.relative;
  predicate_59.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","9.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2c2,0x132900,(char *)&local_6c8,&local_6d0,in_stack_fffffffffffff198,
             predicate_59);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push
            ((psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_> *)
             local_140,10.0);
  local_6e8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<0l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_6f0 = 1.0;
  local_700 = quantile.constant_deltas._M_elems[8];
  predicate_58.absolute = tolerance.relative;
  predicate_58.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2c7,0x132900,(char *)&local_6e8,&local_6f0,in_stack_fffffffffffff198,
             predicate_58);
  local_708 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_710 = 3.0;
  local_720 = quantile.constant_deltas._M_elems[8];
  predicate_57.absolute = tolerance.relative;
  predicate_57.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","3.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2c8,0x132900,(char *)&local_708,&local_710,in_stack_fffffffffffff198,
             predicate_57);
  local_728 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,2l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_730 = 5.0;
  local_740 = quantile.constant_deltas._M_elems[8];
  predicate_56.absolute = tolerance.relative;
  predicate_56.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","5.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2c9,0x132900,(char *)&local_728,&local_730,in_stack_fffffffffffff198,
             predicate_56);
  local_748 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<3l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_750 = 7.0;
  local_760 = quantile.constant_deltas._M_elems[8];
  predicate_55.absolute = tolerance.relative;
  predicate_55.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","7.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2ca,0x132900,(char *)&local_748,&local_750,in_stack_fffffffffffff198,
             predicate_55);
  local_768 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_770 = 10.0;
  local_780 = quantile.constant_deltas._M_elems[8];
  predicate_54.absolute = tolerance.relative;
  predicate_54.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","10.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2cb,0x132900,(char *)&local_768,&local_770,in_stack_fffffffffffff198,
             predicate_54);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push
            ((psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_> *)
             local_140,11.0);
  local_788 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<0l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_790 = 1.0;
  local_7a0 = quantile.constant_deltas._M_elems[8];
  predicate_53.absolute = tolerance.relative;
  predicate_53.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2ce,0x132900,(char *)&local_788,&local_790,in_stack_fffffffffffff198,
             predicate_53);
  local_7a8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_7b0 = 3.0;
  local_7c0 = quantile.constant_deltas._M_elems[8];
  predicate_52.absolute = tolerance.relative;
  predicate_52.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","3.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2cf,0x132900,(char *)&local_7a8,&local_7b0,in_stack_fffffffffffff198,
             predicate_52);
  local_7c8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,2l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_7d0 = 5.0;
  local_7e0 = quantile.constant_deltas._M_elems[8];
  predicate_51.absolute = tolerance.relative;
  predicate_51.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","5.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2d0,0x132900,(char *)&local_7c8,&local_7d0,in_stack_fffffffffffff198,
             predicate_51);
  local_7e8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<3l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_7f0 = 8.0;
  local_800 = quantile.constant_deltas._M_elems[8];
  predicate_50.absolute = tolerance.relative;
  predicate_50.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","8.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2d1,0x132900,(char *)&local_7e8,&local_7f0,in_stack_fffffffffffff198,
             predicate_50);
  local_808 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_810 = 11.0;
  local_820 = quantile.constant_deltas._M_elems[8];
  predicate_49.absolute = tolerance.relative;
  predicate_49.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","11.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2d2,0x132900,(char *)&local_808,&local_810,in_stack_fffffffffffff198,
             predicate_49);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push
            ((psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_> *)
             local_140,12.0);
  local_828 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<0l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_830 = 1.0;
  local_840 = quantile.constant_deltas._M_elems[8];
  predicate_48.absolute = tolerance.relative;
  predicate_48.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2d5,0x132900,(char *)&local_828,&local_830,in_stack_fffffffffffff198,
             predicate_48);
  local_848 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_850 = 3.0;
  local_860 = quantile.constant_deltas._M_elems[8];
  predicate_47.absolute = tolerance.relative;
  predicate_47.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","3.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2d6,0x132900,(char *)&local_848,&local_850,in_stack_fffffffffffff198,
             predicate_47);
  local_868 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,2l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_870 = 5.0;
  local_880 = quantile.constant_deltas._M_elems[8];
  predicate_46.absolute = tolerance.relative;
  predicate_46.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","5.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2d7,0x132900,(char *)&local_868,&local_870,in_stack_fffffffffffff198,
             predicate_46);
  local_888 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<3l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_890 = 9.0;
  local_8a0 = quantile.constant_deltas._M_elems[8];
  predicate_45.absolute = tolerance.relative;
  predicate_45.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","9.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2d8,0x132900,(char *)&local_888,&local_890,in_stack_fffffffffffff198,
             predicate_45);
  local_8a8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_8b0 = 12.0;
  local_8c0 = quantile.constant_deltas._M_elems[8];
  predicate_44.absolute = tolerance.relative;
  predicate_44.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","12.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2d9,0x132900,(char *)&local_8a8,&local_8b0,in_stack_fffffffffffff198,
             predicate_44);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push
            ((psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_> *)
             local_140,13.0);
  local_8c8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<0l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_8d0 = 1.0;
  local_8e0 = quantile.constant_deltas._M_elems[8];
  predicate_43.absolute = tolerance.relative;
  predicate_43.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2dc,0x132900,(char *)&local_8c8,&local_8d0,in_stack_fffffffffffff198,
             predicate_43);
  local_8e8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_8f0 = 3.0;
  local_900 = quantile.constant_deltas._M_elems[8];
  predicate_42.absolute = tolerance.relative;
  predicate_42.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","3.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2dd,0x132900,(char *)&local_8e8,&local_8f0,in_stack_fffffffffffff198,
             predicate_42);
  local_908 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,2l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_910 = 6.0;
  local_920 = quantile.constant_deltas._M_elems[8];
  predicate_41.absolute = tolerance.relative;
  predicate_41.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","6.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2de,0x132900,(char *)&local_908,&local_910,in_stack_fffffffffffff198,
             predicate_41);
  local_928 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<3l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_930 = 10.0;
  local_940 = quantile.constant_deltas._M_elems[8];
  predicate_40.absolute = tolerance.relative;
  predicate_40.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","10.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2df,0x132900,(char *)&local_928,&local_930,in_stack_fffffffffffff198,
             predicate_40);
  local_948 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_950 = 13.0;
  local_960 = quantile.constant_deltas._M_elems[8];
  predicate_39.absolute = tolerance.relative;
  predicate_39.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","13.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2e0,0x132900,(char *)&local_948,&local_950,in_stack_fffffffffffff198,
             predicate_39);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push
            ((psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_> *)
             local_140,14.0);
  local_968 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<0l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_970 = 1.0;
  local_980 = quantile.constant_deltas._M_elems[8];
  predicate_38.absolute = tolerance.relative;
  predicate_38.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2e3,0x132900,(char *)&local_968,&local_970,in_stack_fffffffffffff198,
             predicate_38);
  local_988 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_990 = 3.0;
  local_9a0 = quantile.constant_deltas._M_elems[8];
  predicate_37.absolute = tolerance.relative;
  predicate_37.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","3.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2e4,0x132900,(char *)&local_988,&local_990,in_stack_fffffffffffff198,
             predicate_37);
  local_9a8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,2l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_9b0 = 7.0;
  local_9c0 = quantile.constant_deltas._M_elems[8];
  predicate_36.absolute = tolerance.relative;
  predicate_36.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","7.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2e5,0x132900,(char *)&local_9a8,&local_9b0,in_stack_fffffffffffff198,
             predicate_36);
  local_9c8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<3l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_9d0 = 11.0;
  local_9e0 = quantile.constant_deltas._M_elems[8];
  predicate_35.absolute = tolerance.relative;
  predicate_35.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","11.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2e6,0x132900,(char *)&local_9c8,&local_9d0,in_stack_fffffffffffff198,
             predicate_35);
  local_9e8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_9f0 = 14.0;
  local_a00 = quantile.constant_deltas._M_elems[8];
  predicate_34.absolute = tolerance.relative;
  predicate_34.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","14.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2e7,0x132900,(char *)&local_9e8,&local_9f0,in_stack_fffffffffffff198,
             predicate_34);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push
            ((psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_> *)
             local_140,15.0);
  local_a08 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<0l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_a10 = 1.0;
  local_a20 = quantile.constant_deltas._M_elems[8];
  predicate_33.absolute = tolerance.relative;
  predicate_33.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2ea,0x132900,(char *)&local_a08,&local_a10,in_stack_fffffffffffff198,
             predicate_33);
  local_a28 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_a30 = 4.0;
  local_a40 = quantile.constant_deltas._M_elems[8];
  predicate_32.absolute = tolerance.relative;
  predicate_32.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","4.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2eb,0x132900,(char *)&local_a28,&local_a30,in_stack_fffffffffffff198,
             predicate_32);
  local_a48 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,2l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_a50 = 8.0;
  local_a60 = quantile.constant_deltas._M_elems[8];
  predicate_31.absolute = tolerance.relative;
  predicate_31.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","8.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2ec,0x132900,(char *)&local_a48,&local_a50,in_stack_fffffffffffff198,
             predicate_31);
  local_a68 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<3l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_a70 = 12.0;
  local_a80 = quantile.constant_deltas._M_elems[8];
  predicate_30.absolute = tolerance.relative;
  predicate_30.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","12.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2ed,0x132900,(char *)&local_a68,&local_a70,in_stack_fffffffffffff198,
             predicate_30);
  local_a88 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_a90 = 15.0;
  local_aa0 = quantile.constant_deltas._M_elems[8];
  predicate_29.absolute = tolerance.relative;
  predicate_29.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","15.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2ee,0x132900,(char *)&local_a88,&local_a90,in_stack_fffffffffffff198,
             predicate_29);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push
            ((psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_> *)
             local_140,16.0);
  local_aa8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<0l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_ab0 = 1.0;
  local_ac0 = quantile.constant_deltas._M_elems[8];
  predicate_28.absolute = tolerance.relative;
  predicate_28.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2f1,0x132900,(char *)&local_aa8,&local_ab0,in_stack_fffffffffffff198,
             predicate_28);
  local_ac8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_ad0 = 5.0;
  local_ae0 = quantile.constant_deltas._M_elems[8];
  predicate_27.absolute = tolerance.relative;
  predicate_27.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","5.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2f2,0x132900,(char *)&local_ac8,&local_ad0,in_stack_fffffffffffff198,
             predicate_27);
  local_ae8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,2l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_af0 = 9.0;
  local_b00 = quantile.constant_deltas._M_elems[8];
  predicate_26.absolute = tolerance.relative;
  predicate_26.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","9.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2f3,0x132900,(char *)&local_ae8,&local_af0,in_stack_fffffffffffff198,
             predicate_26);
  local_b08 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<3l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_b10 = 13.0;
  local_b20 = quantile.constant_deltas._M_elems[8];
  predicate_25.absolute = tolerance.relative;
  predicate_25.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","13.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2f4,0x132900,(char *)&local_b08,&local_b10,in_stack_fffffffffffff198,
             predicate_25);
  local_b28 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_b30 = 16.0;
  local_b40 = quantile.constant_deltas._M_elems[8];
  predicate_24.absolute = tolerance.relative;
  predicate_24.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","16.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2f5,0x132900,(char *)&local_b28,&local_b30,in_stack_fffffffffffff198,
             predicate_24);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push
            ((psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_> *)
             local_140,17.0);
  local_b48 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<0l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_b50 = 1.0;
  local_b60 = quantile.constant_deltas._M_elems[8];
  predicate_23.absolute = tolerance.relative;
  predicate_23.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2f8,0x132900,(char *)&local_b48,&local_b50,in_stack_fffffffffffff198,
             predicate_23);
  local_b68 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_b70 = 5.0;
  local_b80 = quantile.constant_deltas._M_elems[8];
  predicate_22.absolute = tolerance.relative;
  predicate_22.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","5.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2f9,0x132900,(char *)&local_b68,&local_b70,in_stack_fffffffffffff198,
             predicate_22);
  local_b88 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,2l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_b90 = 9.0;
  local_ba0 = quantile.constant_deltas._M_elems[8];
  predicate_21.absolute = tolerance.relative;
  predicate_21.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","9.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2fa,0x132900,(char *)&local_b88,&local_b90,in_stack_fffffffffffff198,
             predicate_21);
  local_ba8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<3l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_bb0 = 13.0;
  local_bc0 = quantile.constant_deltas._M_elems[8];
  predicate_20.absolute = tolerance.relative;
  predicate_20.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","13.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2fb,0x132900,(char *)&local_ba8,&local_bb0,in_stack_fffffffffffff198,
             predicate_20);
  local_bc8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_bd0 = 17.0;
  local_be0 = quantile.constant_deltas._M_elems[8];
  predicate_19.absolute = tolerance.relative;
  predicate_19.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","17.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2fc,0x132900,(char *)&local_bc8,&local_bd0,in_stack_fffffffffffff198,
             predicate_19);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push
            ((psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_> *)
             local_140,18.0);
  local_be8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<0l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_bf0 = 1.0;
  local_c00 = quantile.constant_deltas._M_elems[8];
  predicate_18.absolute = tolerance.relative;
  predicate_18.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2ff,0x132900,(char *)&local_be8,&local_bf0,in_stack_fffffffffffff198,
             predicate_18);
  local_c08 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_c10 = 6.0;
  local_c20 = quantile.constant_deltas._M_elems[8];
  predicate_17.absolute = tolerance.relative;
  predicate_17.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","6.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x300,0x132900,(char *)&local_c08,&local_c10,in_stack_fffffffffffff198,
             predicate_17);
  local_c28 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,2l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_c30 = 10.0;
  local_c40 = quantile.constant_deltas._M_elems[8];
  predicate_16.absolute = tolerance.relative;
  predicate_16.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","10.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x301,0x132900,(char *)&local_c28,&local_c30,in_stack_fffffffffffff198,
             predicate_16);
  local_c48 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<3l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_c50 = 14.0;
  local_c60 = quantile.constant_deltas._M_elems[8];
  predicate_15.absolute = tolerance.relative;
  predicate_15.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","14.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x302,0x132900,(char *)&local_c48,&local_c50,in_stack_fffffffffffff198,
             predicate_15);
  local_c68 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_c70 = 18.0;
  local_c80 = quantile.constant_deltas._M_elems[8];
  predicate_14.absolute = tolerance.relative;
  predicate_14.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","18.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x303,0x132900,(char *)&local_c68,&local_c70,in_stack_fffffffffffff198,
             predicate_14);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push
            ((psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_> *)
             local_140,19.0);
  local_c88 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<0l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_c90 = 1.0;
  local_ca0 = quantile.constant_deltas._M_elems[8];
  predicate_13.absolute = tolerance.relative;
  predicate_13.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x306,0x132900,(char *)&local_c88,&local_c90,in_stack_fffffffffffff198,
             predicate_13);
  local_ca8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_cb0 = 5.0;
  local_cc0 = quantile.constant_deltas._M_elems[8];
  predicate_12.absolute = tolerance.relative;
  predicate_12.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","5.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x307,0x132900,(char *)&local_ca8,&local_cb0,in_stack_fffffffffffff198,
             predicate_12);
  local_cc8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,2l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_cd0 = 10.0;
  local_ce0 = quantile.constant_deltas._M_elems[8];
  predicate_11.absolute = tolerance.relative;
  predicate_11.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","10.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x308,0x132900,(char *)&local_cc8,&local_cd0,in_stack_fffffffffffff198,
             predicate_11);
  local_ce8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<3l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_cf0 = 15.0;
  local_d00 = quantile.constant_deltas._M_elems[8];
  predicate_10.absolute = tolerance.relative;
  predicate_10.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","15.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x309,0x132900,(char *)&local_ce8,&local_cf0,in_stack_fffffffffffff198,
             predicate_10);
  local_d08 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_d10 = 19.0;
  local_d20 = quantile.constant_deltas._M_elems[8];
  predicate_09.absolute = tolerance.relative;
  predicate_09.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","19.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x30a,0x132900,(char *)&local_d08,&local_d10,in_stack_fffffffffffff198,
             predicate_09);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push
            ((psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_> *)
             local_140,20.0);
  local_d28 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<0l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_d30 = 1.0;
  local_d40 = quantile.constant_deltas._M_elems[8];
  predicate_08.absolute = tolerance.relative;
  predicate_08.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x30d,0x132900,(char *)&local_d28,&local_d30,in_stack_fffffffffffff198,
             predicate_08);
  local_d48 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_d50 = 6.0;
  local_d60 = quantile.constant_deltas._M_elems[8];
  predicate_07.absolute = tolerance.relative;
  predicate_07.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","6.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x30e,0x132900,(char *)&local_d48,&local_d50,in_stack_fffffffffffff198,
             predicate_07);
  local_d68 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,2l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_d70 = 11.0;
  local_d80 = quantile.constant_deltas._M_elems[8];
  predicate_06.absolute = tolerance.relative;
  predicate_06.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","11.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x30f,0x132900,(char *)&local_d68,&local_d70,in_stack_fffffffffffff198,
             predicate_06);
  local_d88 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<3l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_d90 = 16.0;
  local_da0 = quantile.constant_deltas._M_elems[8];
  predicate_05.absolute = tolerance.relative;
  predicate_05.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","16.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x310,0x132900,(char *)&local_d88,&local_d90,in_stack_fffffffffffff198,
             predicate_05);
  local_da8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_db0 = 20.0;
  local_dc0 = quantile.constant_deltas._M_elems[8];
  predicate_04.absolute = tolerance.relative;
  predicate_04.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","20.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x311,0x132900,(char *)&local_da8,&local_db0,in_stack_fffffffffffff198,
             predicate_04);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push
            ((psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_> *)
             local_140,21.0);
  local_dc8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<0l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_dd0 = 1.0;
  local_de0 = quantile.constant_deltas._M_elems[8];
  predicate_03.absolute = tolerance.relative;
  predicate_03.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x314,0x132900,(char *)&local_dc8,&local_dd0,in_stack_fffffffffffff198,
             predicate_03);
  local_de8 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_df0 = 6.0;
  local_e00 = quantile.constant_deltas._M_elems[8];
  predicate_02.absolute = tolerance.relative;
  predicate_02.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","6.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x315,0x132900,(char *)&local_de8,&local_df0,in_stack_fffffffffffff198,
             predicate_02);
  local_e08 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,2l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_e10 = 11.0;
  local_e20 = quantile.constant_deltas._M_elems[8];
  predicate_01.absolute = tolerance.relative;
  predicate_01.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","11.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x316,0x132900,(char *)&local_e08,&local_e10,in_stack_fffffffffffff198,
             predicate_01);
  local_e28 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<3l,4l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_e30 = 16.0;
  local_e40 = quantile.constant_deltas._M_elems[8];
  predicate_00.absolute = tolerance.relative;
  predicate_00.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","16.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x317,0x132900,(char *)&local_e28,&local_e30,in_stack_fffffffffffff198,
             predicate_00);
  local_e48 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::
              value<std::ratio<1l,1l>>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         local_140);
  local_e50 = 21.0;
  predicate.absolute = tolerance.relative;
  predicate.relative = quantile.constant_deltas._M_elems[8];
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","21.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x318,0x132900,(char *)&local_e48,&local_e50,in_stack_fffffffffffff198,
             predicate);
  return;
}

Assistant:

void test_linear_increase()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    quantile::psquare_quartile<double> quantile;

    quantile.push(1);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 1.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 1.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 1.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 1.0, tolerance);

    quantile.push(2);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 1.25, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 1.5, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 1.75, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 2.0, tolerance);

    quantile.push(3);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 1.5, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 2.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 2.5, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 3.0, tolerance);

    quantile.push(4);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 1.75, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 2.5, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 3.25, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 4.0, tolerance);

    quantile.push(5);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 2.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 3.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 4.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 5.0, tolerance);

    quantile.push(6);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 2.25, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 3.5, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 4.75, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 6.0, tolerance);

    quantile.push(7);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 2.5, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 4.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 5.5, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 7.0, tolerance);

    quantile.push(8);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 2.75, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 4.5, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 6.25, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 8.0, tolerance);

    quantile.push(9);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 3.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 5.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 7.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 9.0, tolerance);

    // Switch to approximation

    quantile.push(10);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 3.0, tolerance); // 3.25
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 5.0, tolerance); // 5.5
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 7.0, tolerance); // 7.75
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 10.0, tolerance);

    quantile.push(11);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance); // 1.0
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 3.0, tolerance); // 3.5
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 5.0, tolerance); // 6.0
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 8.0, tolerance); // 8.5
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 11.0, tolerance); // 11.0

    quantile.push(12);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance); // 1.0
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 3.0, tolerance); // 3.75
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 5.0, tolerance); // 6.5
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 9.0, tolerance); // 9.25
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 12.0, tolerance); // 12.0

    quantile.push(13);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance); // 1.0
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 3.0, tolerance); // 4.0
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 6.0, tolerance); // 7.0
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 10.0, tolerance); // 10.0
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 13.0, tolerance); // 13.0

    quantile.push(14);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance); // 1.0
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 3.0, tolerance); // 4.25
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 7.0, tolerance); // 7.5
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 11.0, tolerance); // 10.75
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 14.0, tolerance); // 14.0

    quantile.push(15);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance); // 1.0
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 4.0, tolerance); // 4.5
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 8.0, tolerance); // 8.0
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 12.0, tolerance); // 11.5
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 15.0, tolerance); // 15.0

    quantile.push(16);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance); // 1.0
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 5.0, tolerance); // 4.75
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 9.0, tolerance); // 8.5
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 13.0, tolerance); // 12.25
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 16.0, tolerance); // 16.0

    quantile.push(17);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance); // 1.0
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 5.0, tolerance); // 5.0
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 9.0, tolerance); // 9.0
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 13.0, tolerance); // 13.0
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 17.0, tolerance); // 17.0

    quantile.push(18);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance); // 1.0
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 6.0, tolerance); // 5.25
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 10.0, tolerance); // 9.5
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 14.0, tolerance); // 13.75
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 18.0, tolerance); // 18.0

    quantile.push(19);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance); // 1.0
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 5.0, tolerance); // 5.5
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 10.0, tolerance); // 10.0
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 15.0, tolerance); // 14.5
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 19.0, tolerance); // 19.0

    quantile.push(20);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance); // 1.0
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 6.0, tolerance); // 5.75
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 11.0, tolerance); // 10.5
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 16.0, tolerance); // 15.25
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 20.0, tolerance); // 20.0

    quantile.push(21);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance); // 1.0
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 6.0, tolerance); // 6.0
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 11.0, tolerance); // 11.0
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 16.0, tolerance); // 16.0
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 21.0, tolerance); // 21.0
}